

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseBiosRegion
          (FfsParser *this,UByteArray *bios,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  UByteArray local_e8;
  UByteArray local_c8;
  CBString local_a8;
  UModelIndex local_90;
  undefined1 local_68 [8];
  CBString info;
  CBString name;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *bios_local;
  FfsParser *this_local;
  
  bVar1 = UByteArray::isEmpty(bios);
  if (bVar1) {
    this_local = (FfsParser *)0xc;
  }
  else {
    Bstrlib::CBString::CBString((CBString *)&info.super_tagbstring.data,"BIOS region");
    uVar2 = UByteArray::size(bios);
    uVar3 = UByteArray::size(bios);
    usprintf((CBString *)local_68,"Full size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_a8);
    UByteArray::UByteArray(&local_c8);
    UByteArray::UByteArray(&local_e8);
    TreeModel::addItem(&local_90,this_00,localOffset,'?','\x01',
                       (CBString *)&info.super_tagbstring.data,&local_a8,(CBString *)local_68,
                       &local_c8,bios,&local_e8,Fixed,parent,'\0');
    index->m = local_90.m;
    index->r = local_90.r;
    index->c = local_90.c;
    index->i = local_90.i;
    UByteArray::~UByteArray(&local_e8);
    UByteArray::~UByteArray(&local_c8);
    Bstrlib::CBString::~CBString(&local_a8);
    this_local = (FfsParser *)parseRawArea(this,index);
    Bstrlib::CBString::~CBString((CBString *)local_68);
    Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseBiosRegion(const UByteArray & bios, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Sanity check
    if (bios.isEmpty())
        return U_EMPTY_REGION;
    
    // Get info
    UString name("BIOS region");
    UString info = usprintf("Full size: %Xh (%u)", (UINT32)bios.size(), (UINT32)bios.size());
    
    // Add tree item
    index = model->addItem(localOffset, Types::Region, Subtypes::BiosRegion, name, UString(), info, UByteArray(), bios, UByteArray(), Fixed, parent);
    
    return parseRawArea(index);
}